

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  
  if (ptr == end) {
    return -1;
  }
  bVar1 = *ptr;
  if (bVar1 < 0xdc) {
    if (bVar1 - 0xd8 < 4) {
switchD_0015c8cb_caseD_7:
      if ((long)end - (long)ptr < 4) {
        return -2;
      }
    }
    else {
      if (bVar1 != 0) goto LAB_0015c8ed;
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      iVar3 = 0x16;
      switch(cVar2) {
      case '\x05':
        if ((long)end - (long)ptr < 2) {
          return -2;
        }
        break;
      case '\x06':
        if ((long)end - (long)ptr < 3) {
          return -2;
        }
        break;
      case '\a':
        goto switchD_0015c8cb_caseD_7;
      case '\b':
      case '\v':
      case '\f':
      case '\r':
      case '\x0e':
      case '\x0f':
      case '\x10':
      case '\x11':
      case '\x12':
      case '\x13':
      case '\x14':
      case '\x17':
        break;
      case '\t':
      case '\n':
      case '\x15':
        goto switchD_0015c8cb_caseD_9;
      case '\x16':
      case '\x18':
        goto switchD_0015c8cb_caseD_16;
      default:
        if (cVar2 == '\x1e') goto switchD_0015c8cb_caseD_9;
        if (cVar2 == '\x1d') goto LAB_0015c8ed;
      }
    }
  }
  else {
    if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)ptr[1]))))
    goto switchD_0015c8cb_caseD_8;
LAB_0015c8ed:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)ptr[1] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
         >> ((byte)ptr[1] & 0x1f) & 1) != 0) {
switchD_0015c8cb_caseD_16:
      if (ptr + 2 == end) {
        return -1;
      }
      lVar4 = (long)end - (long)ptr;
      ptr = ptr + 4;
LAB_0015c955:
      lVar4 = lVar4 + -2;
      bVar1 = ptr[-2];
      if (0xdb < bVar1) {
        if (bVar1 == 0xff) {
          if ((byte)ptr[-1] < 0xfe) goto switchD_0015c988_caseD_1d;
        }
        else if (3 < bVar1 - 0xdc) goto switchD_0015c988_caseD_1d;
        goto switchD_0015c988_caseD_8;
      }
      if (bVar1 != 0) {
        if (bVar1 - 0xd8 < 4) {
switchD_0015c988_caseD_7:
          if (lVar4 < 4) {
            return -2;
          }
        }
        else {
switchD_0015c988_caseD_1d:
          if ((*(uint *)((long)namingBitmap +
                        (ulong)((byte)ptr[-1] >> 3 & 0x1c |
                               (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
               ((byte)ptr[-1] & 0x1f) & 1) != 0) goto switchD_0015c988_caseD_16;
        }
        goto switchD_0015c988_caseD_8;
      }
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[-1])) {
      case 5:
        if (lVar4 < 2) {
          return -2;
        }
        break;
      case 6:
        if (lVar4 < 3) {
          return -2;
        }
        break;
      case 7:
        goto switchD_0015c988_caseD_7;
      case 0x12:
        iVar3 = 0x1c;
        goto switchD_0015c8cb_caseD_9;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_0015c988_caseD_16;
      case 0x1d:
        goto switchD_0015c988_caseD_1d;
      }
switchD_0015c988_caseD_8:
      ptr = ptr + -2;
    }
  }
switchD_0015c8cb_caseD_8:
  iVar3 = 0;
switchD_0015c8cb_caseD_9:
  *nextTokPtr = ptr;
  return iVar3;
switchD_0015c988_caseD_16:
  bVar5 = ptr == end;
  ptr = ptr + 2;
  if (bVar5) {
    return -1;
  }
  goto LAB_0015c955;
}

Assistant:

static
int PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S: case BT_LF: case BT_CR: case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}